

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O1

void __thiscall
LowererMDArch::EmitUIntToFloat(LowererMDArch *this,Opnd *dst,Opnd *src,Instr *instrInsert)

{
  IRType IVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *dstOpnd;
  Instr *pIVar6;
  Opnd *src1Opnd;
  
  OVar3 = IR::Opnd::GetKind(dst);
  if ((OVar3 != OpndKindReg) || (1 < (byte)(dst->m_type - TyFloat32))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa57,"(dst->IsRegOpnd() && dst->IsFloat())",
                       "dst->IsRegOpnd() && dst->IsFloat()");
    if (!bVar4) goto LAB_00650dd3;
    *puVar5 = 0;
  }
  OVar3 = IR::Opnd::GetKind(src);
  if ((OVar3 != OpndKindReg) || ((src->m_type | TyInt64) != TyUint32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa58,"(src->IsRegOpnd() && (src->IsInt32() || src->IsUInt32()))",
                       "src->IsRegOpnd() && (src->IsInt32() || src->IsUInt32())");
    if (!bVar4) {
LAB_00650dd3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  dstOpnd = IR::RegOpnd::New(TyInt32,this->m_func);
  pIVar6 = IR::Instr::New(MOV_TRUNC,&dstOpnd->super_Opnd,src,this->m_func);
  IR::Instr::InsertBefore(instrInsert,pIVar6);
  IVar1 = dst->m_type;
  src1Opnd = IR::Opnd::UseWithNewType(&dstOpnd->super_Opnd,TyInt64,this->m_func);
  pIVar6 = IR::Instr::New(IVar1 == TyFloat64 ^ CVTSI2SS,dst,src1Opnd,this->m_func);
  IR::Instr::InsertBefore(instrInsert,pIVar6);
  return;
}

Assistant:

void
LowererMDArch::EmitUIntToFloat(IR::Opnd *dst, IR::Opnd *src, IR::Instr *instrInsert)
{
    Assert(dst->IsRegOpnd() && dst->IsFloat());
    Assert(src->IsRegOpnd() && (src->IsInt32() || src->IsUInt32()));

    // MOV tempReg.i32, src  - make sure the top bits are 0
    IR::RegOpnd * tempReg = IR::RegOpnd::New(TyInt32, this->m_func);
    instrInsert->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC, tempReg, src, this->m_func));

    // CVTSI2SD dst, tempReg.i64  (Use the tempreg as if it is 64 bit without sign extension)
    instrInsert->InsertBefore(IR::Instr::New(dst->IsFloat64() ? Js::OpCode::CVTSI2SD : Js::OpCode::CVTSI2SS, dst,
        tempReg->UseWithNewType(TyInt64, this->m_func), this->m_func));
}